

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

bool absl::lts_20250127::anon_unknown_1::ConsumeDurationNumber
               (char **dpp,char *ep,int64_t *int_part,int64_t *frac_part,int64_t *frac_scale)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  bool local_4d;
  int d_1;
  bool int_part_empty;
  int d;
  char *start;
  int64_t *frac_scale_local;
  int64_t *frac_part_local;
  int64_t *int_part_local;
  char *ep_local;
  char **dpp_local;
  
  *int_part = 0;
  *frac_part = 0;
  *frac_scale = 1;
  pcVar1 = *dpp;
  while( true ) {
    if (((*dpp == ep) || (iVar3 = **dpp + -0x30, iVar3 < 0)) || (9 < iVar3)) {
      pcVar2 = *dpp;
      if ((*dpp == ep) || (**dpp != '.')) {
        dpp_local._7_1_ = pcVar2 != pcVar1;
      }
      else {
        *dpp = *dpp + 1;
        while (((*dpp != ep && (iVar3 = **dpp + -0x30, -1 < iVar3)) && (iVar3 < 10))) {
          if (*frac_scale < 0xccccccccccccccd) {
            *frac_part = *frac_part * 10;
            *frac_part = (long)iVar3 + *frac_part;
            *frac_scale = *frac_scale * 10;
          }
          *dpp = *dpp + 1;
        }
        local_4d = true;
        if (pcVar2 == pcVar1) {
          local_4d = *frac_scale != 1;
        }
        dpp_local._7_1_ = local_4d;
      }
      return dpp_local._7_1_;
    }
    if (0xccccccccccccccc < *int_part) {
      return false;
    }
    *int_part = *int_part * 10;
    if (0x7fffffffffffffff - (long)iVar3 < *int_part) break;
    *int_part = (long)iVar3 + *int_part;
    *dpp = *dpp + 1;
  }
  return false;
}

Assistant:

bool ConsumeDurationNumber(const char** dpp, const char* ep, int64_t* int_part,
                           int64_t* frac_part, int64_t* frac_scale) {
  *int_part = 0;
  *frac_part = 0;
  *frac_scale = 1;  // invariant: *frac_part < *frac_scale
  const char* start = *dpp;
  for (; *dpp != ep; *dpp += 1) {
    const int d = **dpp - '0';  // contiguous digits
    if (d < 0 || 10 <= d) break;

    if (*int_part > kint64max / 10) return false;
    *int_part *= 10;
    if (*int_part > kint64max - d) return false;
    *int_part += d;
  }
  const bool int_part_empty = (*dpp == start);
  if (*dpp == ep || **dpp != '.') return !int_part_empty;

  for (*dpp += 1; *dpp != ep; *dpp += 1) {
    const int d = **dpp - '0';  // contiguous digits
    if (d < 0 || 10 <= d) break;
    if (*frac_scale <= kint64max / 10) {
      *frac_part *= 10;
      *frac_part += d;
      *frac_scale *= 10;
    }
  }
  return !int_part_empty || *frac_scale != 1;
}